

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O3

double getQuadraticObjective(Quadratic *idata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = vectorProduct(&(idata->lp).col_cost_,&(idata->xk).col_value);
  dVar2 = vectorProduct(&idata->lambda,&idata->residual);
  dVar3 = vectorProduct(&idata->residual,&idata->lambda);
  return dVar3 / (idata->mu + idata->mu) + dVar2 + dVar1;
}

Assistant:

double getQuadraticObjective(const Quadratic& idata) {
  // c'x
  double quadratic = vectorProduct(idata.lp.col_cost_, idata.xk.col_value);

  // lambda'x
  quadratic += vectorProduct(idata.lambda, idata.residual);

  // 1/2mu r'r
  double rtr = vectorProduct(idata.residual, idata.lambda);
  quadratic += rtr / (2 * idata.mu);

  return quadratic;
}